

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::EndArray
          (Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *this,SizeType elementCount)

{
  unsigned_long *puVar1;
  uint local_2c;
  SizeType i;
  uint64_t *e;
  uint64_t h;
  SizeType elementCount_local;
  Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_local;
  
  e = (uint64_t *)Hash(0,4);
  puVar1 = Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::Pop<unsigned_long>
                     (&this->stack_,(ulong)elementCount);
  for (local_2c = 0; local_2c < elementCount; local_2c = local_2c + 1) {
    e = (uint64_t *)Hash((uint64_t)e,puVar1[local_2c]);
  }
  puVar1 = Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::Push<unsigned_long>
                     (&this->stack_,1);
  *puVar1 = (unsigned_long)e;
  return true;
}

Assistant:

bool EndArray(SizeType elementCount) { 
        uint64_t h = Hash(0, kArrayType);
        uint64_t* e = stack_.template Pop<uint64_t>(elementCount);
        for (SizeType i = 0; i < elementCount; i++)
            h = Hash(h, e[i]); // Use hash to achieve element order sensitive
        *stack_.template Push<uint64_t>() = h;
        return true;
    }